

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ExtensionDescriptorTest_ExtensionRanges_Test::TestBody
          (ExtensionDescriptorTest_ExtensionRanges_Test *this)

{
  bool bVar1;
  char *pcVar2;
  ExtensionRange *pEVar3;
  AssertHelper local_118;
  Message local_110;
  int local_108 [2];
  undefined1 local_100 [8];
  AssertionResult gtest_ar_5;
  Message local_e8;
  int local_e0 [2];
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_4;
  Message local_c0;
  int local_b8 [2];
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_3;
  Message local_98;
  int local_90 [2];
  undefined1 local_88 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_70;
  Message local_68;
  int local_60 [2];
  undefined1 local_58 [8];
  AssertionResult gtest_ar_1;
  Message local_40 [3];
  int local_28 [2];
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  ExtensionDescriptorTest_ExtensionRanges_Test *this_local;
  
  local_28[1] = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_28[0] = Descriptor::extension_range_count((this->super_ExtensionDescriptorTest).bar_);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_20,"0","bar_->extension_range_count()",local_28 + 1,local_28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x902,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_60[1] = 2;
  local_60[0] = Descriptor::extension_range_count((this->super_ExtensionDescriptorTest).foo_);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_58,"2","foo_->extension_range_count()",local_60 + 1,local_60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x903,pcVar2);
    testing::internal::AssertHelper::operator=(&local_70,&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::Message::~Message(&local_68);
  }
  gtest_ar_2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  if (gtest_ar_2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_90[1] = 10;
    pEVar3 = Descriptor::extension_range((this->super_ExtensionDescriptorTest).foo_,0);
    local_90[0] = Descriptor::ExtensionRange::start_number(pEVar3);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_88,"10","foo_->extension_range(0)->start_number()",local_90 + 1,
               local_90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
    if (!bVar1) {
      testing::Message::Message(&local_98);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x905,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_98);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_98);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
    local_b8[1] = 0x1e;
    pEVar3 = Descriptor::extension_range((this->super_ExtensionDescriptorTest).foo_,1);
    local_b8[0] = Descriptor::ExtensionRange::start_number(pEVar3);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_b0,"30","foo_->extension_range(1)->start_number()",local_b8 + 1,
               local_b8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
    if (!bVar1) {
      testing::Message::Message(&local_c0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x906,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_c0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
    local_e0[1] = 0x14;
    pEVar3 = Descriptor::extension_range((this->super_ExtensionDescriptorTest).foo_,0);
    local_e0[0] = Descriptor::ExtensionRange::end_number(pEVar3);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_d8,"20","foo_->extension_range(0)->end_number()",local_e0 + 1,
               local_e0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
    if (!bVar1) {
      testing::Message::Message(&local_e8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x908,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
      testing::Message::~Message(&local_e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
    local_108[1] = 0x28;
    pEVar3 = Descriptor::extension_range((this->super_ExtensionDescriptorTest).foo_,1);
    local_108[0] = Descriptor::ExtensionRange::end_number(pEVar3);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_100,"40","foo_->extension_range(1)->end_number()",local_108 + 1,
               local_108);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
    if (!bVar1) {
      testing::Message::Message(&local_110);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x909,pcVar2);
      testing::internal::AssertHelper::operator=(&local_118,&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      testing::Message::~Message(&local_110);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  }
  return;
}

Assistant:

TEST_F(ExtensionDescriptorTest, ExtensionRanges) {
  EXPECT_EQ(0, bar_->extension_range_count());
  ASSERT_EQ(2, foo_->extension_range_count());

  EXPECT_EQ(10, foo_->extension_range(0)->start_number());
  EXPECT_EQ(30, foo_->extension_range(1)->start_number());

  EXPECT_EQ(20, foo_->extension_range(0)->end_number());
  EXPECT_EQ(40, foo_->extension_range(1)->end_number());
}